

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void c4::yml::anon_unknown_0::_resolve_tags(Tree *t,size_t node)

{
  csubstr tag;
  size_t node_00;
  NodeData *pNVar1;
  csubstr *pcVar2;
  Tree *in_RSI;
  Tree *in_RDI;
  bool bVar3;
  csubstr cVar4;
  size_t child;
  size_t in_stack_000000c8;
  Tree *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  Tree *in_stack_ffffffffffffff08;
  Tree *in_stack_ffffffffffffff10;
  csubstr in_stack_ffffffffffffff58;
  Tree *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  Tree *in_stack_ffffffffffffff78;
  
  node_00 = Tree::first_child(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
  while (node_00 != 0xffffffffffffffff) {
    pNVar1 = Tree::_p((Tree *)in_stack_ffffffffffffff58.len,(size_t)in_stack_ffffffffffffff58.str);
    if ((((pNVar1->m_type).type & KEY) != NOTYPE) &&
       (pNVar1 = Tree::_p((Tree *)in_stack_ffffffffffffff58.len,
                          (size_t)in_stack_ffffffffffffff58.str),
       ((pNVar1->m_type).type & (KEYTAG|KEY)) == (KEYTAG|KEY))) {
      pcVar2 = Tree::key_tag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff58.len);
      in_stack_ffffffffffffff68 = (Tree *)pcVar2->str;
      in_stack_ffffffffffffff70 = (char *)pcVar2->len;
      cVar4 = _transform_tag(in_stack_000000d0,(csubstr)in_stack_000000d8,in_stack_000000c8);
      in_stack_ffffffffffffff78 = (Tree *)cVar4.str;
      cVar4.len = (size_t)in_stack_ffffffffffffff78;
      cVar4.str = in_stack_ffffffffffffff70;
      Tree::set_key_tag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff58.len,cVar4);
    }
    pNVar1 = Tree::_p((Tree *)in_stack_ffffffffffffff58.len,(size_t)in_stack_ffffffffffffff58.str);
    if (((pNVar1->m_type).type & VAL) != NOTYPE) {
      pNVar1 = Tree::_p((Tree *)in_stack_ffffffffffffff58.len,(size_t)in_stack_ffffffffffffff58.str)
      ;
      bVar3 = false;
      if (((pNVar1->m_type).type & VALTAG) != NOTYPE) {
        bVar3 = ((pNVar1->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
      }
      if (bVar3) {
        in_stack_ffffffffffffff08 = in_RDI;
        in_stack_ffffffffffffff10 = in_RDI;
        Tree::val_tag(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff58 =
             _transform_tag(in_stack_000000d0,(csubstr)in_stack_000000d8,in_stack_000000c8);
        tag.len = (size_t)in_stack_ffffffffffffff70;
        tag.str = (char *)in_stack_ffffffffffffff68;
        Tree::set_val_tag((Tree *)in_stack_ffffffffffffff58.len,
                          (size_t)in_stack_ffffffffffffff58.str,tag);
      }
    }
    _resolve_tags(in_RSI,node_00);
    node_00 = Tree::next_sibling(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void _resolve_tags(Tree *t, size_t node)
{
    for(size_t child = t->first_child(node); child != NONE; child = t->next_sibling(child))
    {
        if(t->has_key(child) && t->has_key_tag(child))
            t->set_key_tag(child, _transform_tag(t, t->key_tag(child), child));
        if(t->has_val(child) && t->has_val_tag(child))
            t->set_val_tag(child, _transform_tag(t, t->val_tag(child), child));
        _resolve_tags(t, child);
    }
}